

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::DefinitionSymbol::ParameterDecl::ParameterDecl
          (ParameterDecl *this,Scope *scope,ParameterDeclarationSyntax *syntax,
          DeclaratorSyntax *decl,bool isLocal,bool isPort,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes)

{
  SourceLocation SVar1;
  long in_RCX;
  Token *in_RDX;
  undefined8 *in_RDI;
  byte in_R8B;
  byte in_R9B;
  string_view sVar2;
  undefined8 in_stack_00000008;
  Scope *in_stack_00000010;
  SourceLocation in_stack_00000018;
  DiagCode in_stack_00000024;
  size_t local_38;
  char *local_30;
  
  *in_RDI = in_RDX;
  in_RDI[1] = in_RCX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 2));
  SourceLocation::SourceLocation((SourceLocation *)(in_RDI + 4));
  in_RDI[5] = in_stack_00000008;
  in_RDI[6] = in_stack_00000010;
  *(undefined1 *)(in_RDI + 7) = 0;
  *(byte *)((long)in_RDI + 0x39) = in_R8B & 1;
  *(byte *)((long)in_RDI + 0x3a) = in_R9B & 1;
  *(undefined1 *)((long)in_RDI + 0x3b) = 1;
  sVar2 = parsing::Token::valueText(in_RDX);
  local_38 = sVar2._M_len;
  in_RDI[2] = local_38;
  local_30 = sVar2._M_str;
  in_RDI[3] = local_30;
  SVar1 = parsing::Token::location((Token *)(in_RCX + 0x18));
  *(SourceLocation *)(in_RDI + 4) = SVar1;
  if (*(long *)(in_RCX + 0x60) == 0) {
    if ((in_R9B & 1) == 0) {
      Scope::addDiag(in_stack_00000010,in_stack_00000024,in_stack_00000018);
    }
    else if ((in_R8B & 1) != 0) {
      Scope::addDiag(in_stack_00000010,in_stack_00000024,in_stack_00000018);
    }
  }
  return;
}

Assistant:

DefinitionSymbol::ParameterDecl::ParameterDecl(
    const Scope& scope, const ParameterDeclarationSyntax& syntax, const DeclaratorSyntax& decl,
    bool isLocal, bool isPort, std::span<const syntax::AttributeInstanceSyntax* const> attributes) :
    valueSyntax(&syntax), valueDecl(&decl), attributes(attributes), isTypeParam(false),
    isLocalParam(isLocal), isPortParam(isPort), hasSyntax(true) {

    name = decl.name.valueText();
    location = decl.name.location();

    if (!decl.initializer) {
        if (!isPort)
            scope.addDiag(diag::BodyParamNoInitializer, location);
        else if (isLocal)
            scope.addDiag(diag::LocalParamNoInitializer, location);
    }
}